

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

char * psftp_getcwd(void)

{
  int *piVar1;
  char *pcVar2;
  size_t local_28;
  size_t size;
  char *ret;
  char *buffer;
  
  local_28 = 0x100;
  ret = (char *)safemalloc(0x100,1,0);
  while( true ) {
    size = (size_t)getcwd(ret,local_28);
    if ((char *)size != (char *)0x0) {
      return (char *)size;
    }
    piVar1 = __errno_location();
    if (*piVar1 != 0x22) break;
    ret = (char *)safegrowarray(ret,&local_28,1,local_28,1,false);
  }
  safefree(ret);
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  pcVar2 = dupprintf("[cwd unavailable: %s]",pcVar2);
  return pcVar2;
}

Assistant:

char *psftp_getcwd(void)
{
    char *buffer, *ret;
    size_t size = 256;

    buffer = snewn(size, char);
    while (1) {
        ret = getcwd(buffer, size);
        if (ret != NULL)
            return ret;
        if (errno != ERANGE) {
            sfree(buffer);
            return dupprintf("[cwd unavailable: %s]", strerror(errno));
        }
        /*
         * Otherwise, ERANGE was returned, meaning the buffer
         * wasn't big enough.
         */
        sgrowarray(buffer, size, size);
    }
}